

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
booster::locale::details::format_parser::set_flag_with_str<char>
          (format_parser *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  ulong uVar1;
  string_set *this_00;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((char *)key);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)key);
    if (iVar2 != 0) {
      return;
    }
  }
  uVar1 = booster::locale::ios_info::get(*(ios_base **)this);
  booster::locale::ios_info::display_flags(uVar1);
  booster::locale::ios_info::get(*(ios_base **)this);
  this_00 = (string_set *)booster::locale::ios_info::date_time_pattern_set();
  ios_info::string_set::set<char>(this_00,(value->_M_dataplus)._M_p);
  return;
}

Assistant:

void set_flag_with_str(std::string const &key,std::basic_string<CharType> const &value)
                {
                    if(key=="ftime" || key=="strftime") {
                        as::strftime(ios_);
                        ios_info::get(ios_).date_time_pattern(value);
                    }
                }